

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::parse_neighbor_features(string *nf_string,search *sch)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  v_array<int> *this;
  substring s;
  int32_t enc;
  vector<substring,_std::allocator<substring>_> cmd;
  uint local_5c;
  vector<substring,_std::allocator<substring>_> local_58;
  char *local_38;
  
  this = &sch->priv->neighbor_features;
  v_array<int>::clear(this);
  if (nf_string->_M_string_length != 0) {
    pcVar2 = (char *)operator_new__(nf_string->_M_string_length + 1);
    strcpy(pcVar2,(nf_string->_M_dataplus)._M_p);
    local_38 = pcVar2;
    pcVar2 = strtok(pcVar2,",");
    local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
    super__Vector_impl_data._M_start = (substring *)0x0;
    local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
    super__Vector_impl_data._M_finish = (substring *)0x0;
    local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pcVar2 != (char *)0x0) {
      do {
        if (local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        sVar3 = strlen(pcVar2);
        s.end = pcVar2 + sVar3;
        s.begin = pcVar2;
        tokenize<std::vector<substring,std::allocator<substring>>>(':',s,&local_58,true);
        lVar4 = (long)local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4;
        if (lVar4 == 2) {
          iVar1 = int_of_substring(*local_58.
                                    super__Vector_base<substring,_std::allocator<substring>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
          local_5c = 0x20;
          if (local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
              super__Vector_impl_data._M_start[1].begin <
              local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
              super__Vector_impl_data._M_start[1].end) {
            local_5c = (uint)(byte)*local_58.
                                    super__Vector_base<substring,_std::allocator<substring>_>.
                                    _M_impl.super__Vector_impl_data._M_start[1].begin;
          }
        }
        else if (lVar4 == 1) {
          iVar1 = int_of_substring(*local_58.
                                    super__Vector_base<substring,_std::allocator<substring>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
          local_5c = 0x20;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"warning: ignoring malformed neighbor specification: \'",
                     0x35);
          sVar3 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          local_5c = 0x20;
          iVar1 = 0;
        }
        local_5c = iVar1 << 0x18 | local_5c;
        v_array<int>::push_back(this,(int *)&local_5c);
        pcVar2 = strtok((char *)0x0,",");
      } while (pcVar2 != (char *)0x0);
    }
    operator_delete__(local_38);
    if (local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
        super__Vector_impl_data._M_start != (substring *)0x0) {
      operator_delete(local_58.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void parse_neighbor_features(string& nf_string, search& sch)
{
  search_private& priv = *sch.priv;
  priv.neighbor_features.clear();
  size_t len = nf_string.length();
  if (len == 0)
    return;

  char* cstr = new char[len + 1];
  strcpy(cstr, nf_string.c_str());

  char* p = strtok(cstr, ",");
  std::vector<substring> cmd;
  while (p != 0)
  {
    cmd.clear();
    substring me = {p, p + strlen(p)};
    tokenize(':', me, cmd, true);

    int32_t posn = 0;
    char ns = ' ';
    if (cmd.size() == 1)
    {
      posn = int_of_substring(cmd[0]);
      ns = ' ';
    }
    else if (cmd.size() == 2)
    {
      posn = int_of_substring(cmd[0]);
      ns = (cmd[1].end > cmd[1].begin) ? cmd[1].begin[0] : ' ';
    }
    else
    {
      std::cerr << "warning: ignoring malformed neighbor specification: '" << p << "'" << endl;
    }
    int32_t enc = (posn << 24) | (ns & 0xFF);
    priv.neighbor_features.push_back(enc);

    p = strtok(nullptr, ",");
  }

  delete[] cstr;
}